

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O2

unique_ptr<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_type_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *parent)

{
  json_type jVar1;
  bool bVar2;
  schema_error *psVar3;
  uri *in_R8;
  iterator this_00;
  const_array_range_type cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  type type;
  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  expected_types;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string keyword;
  uri schema_location;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&keyword,"type",(allocator<char> *)&schema_location);
  jsoncons::uri::uri(&schema_location,(uri *)sch);
  expected_types.
  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expected_types.
  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expected_types.
  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  jVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type(parent);
  if (jVar1 == string_value) {
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    as_string<std::allocator<char>>
              (&type,(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     parent);
    bVar2 = std::operator==(&type,"null");
    if (bVar2) {
      local_1b8._M_dataplus._M_p._0_4_ = 0;
      std::
      vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
      ::emplace_back<jsoncons::jsonschema::json_schema_type>
                (&expected_types,(json_schema_type *)&local_1b8);
    }
    else {
      bVar2 = std::operator==(&type,"object");
      if (bVar2) {
        local_1b8._M_dataplus._M_p._0_4_ = 1;
        std::
        vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
        ::emplace_back<jsoncons::jsonschema::json_schema_type>
                  (&expected_types,(json_schema_type *)&local_1b8);
      }
      else {
        bVar2 = std::operator==(&type,"array");
        if (bVar2) {
          local_1b8._M_dataplus._M_p._0_4_ = 2;
          std::
          vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
          ::emplace_back<jsoncons::jsonschema::json_schema_type>
                    (&expected_types,(json_schema_type *)&local_1b8);
        }
        else {
          bVar2 = std::operator==(&type,"string");
          if (bVar2) {
            local_1b8._M_dataplus._M_p._0_4_ = 3;
            std::
            vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ::emplace_back<jsoncons::jsonschema::json_schema_type>
                      (&expected_types,(json_schema_type *)&local_1b8);
          }
          else {
            bVar2 = std::operator==(&type,"boolean");
            if (bVar2) {
              local_1b8._M_dataplus._M_p._0_4_ = 4;
              std::
              vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ::emplace_back<jsoncons::jsonschema::json_schema_type>
                        (&expected_types,(json_schema_type *)&local_1b8);
            }
            else {
              bVar2 = std::operator==(&type,"integer");
              if (bVar2) {
                local_1b8._M_dataplus._M_p._0_4_ = 5;
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::emplace_back<jsoncons::jsonschema::json_schema_type>
                          (&expected_types,(json_schema_type *)&local_1b8);
              }
              else {
                bVar2 = std::operator==(&type,"number");
                if (!bVar2) {
                  psVar3 = (schema_error *)__cxa_allocate_exception(0x18);
                  std::operator+(&local_140,&schema_location.uri_string_,": ");
                  std::operator+(&local_120,&local_140,"Invalid type \'");
                  std::operator+(&local_100,&local_120,&type);
                  std::operator+(&local_1b8,&local_100,"\'");
                  schema_error::schema_error(psVar3,&local_1b8);
                  __cxa_throw(psVar3,&schema_error::typeinfo,schema_error::~schema_error);
                }
                local_1b8._M_dataplus._M_p._0_4_ = 6;
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::emplace_back<jsoncons::jsonschema::json_schema_type>
                          (&expected_types,(json_schema_type *)&local_1b8);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&type);
  }
  else if (jVar1 == array_value) {
    cVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::array_range
                      (parent);
    for (this_00 = cVar4.first_._M_current; this_00._M_current != cVar4.last_._M_current._M_current;
        this_00._M_current = this_00._M_current + 0x10) {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      as_string<std::allocator<char>>
                (&type,(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       this_00._M_current);
      bVar2 = std::operator==(&type,"null");
      if (bVar2) {
        local_1b8._M_dataplus._M_p._0_4_ = 0;
        std::
        vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
        ::emplace_back<jsoncons::jsonschema::json_schema_type>
                  (&expected_types,(json_schema_type *)&local_1b8);
      }
      else {
        bVar2 = std::operator==(&type,"object");
        if (bVar2) {
          local_1b8._M_dataplus._M_p._0_4_ = 1;
          std::
          vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
          ::emplace_back<jsoncons::jsonschema::json_schema_type>
                    (&expected_types,(json_schema_type *)&local_1b8);
        }
        else {
          bVar2 = std::operator==(&type,"array");
          if (bVar2) {
            local_1b8._M_dataplus._M_p._0_4_ = 2;
            std::
            vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ::emplace_back<jsoncons::jsonschema::json_schema_type>
                      (&expected_types,(json_schema_type *)&local_1b8);
          }
          else {
            bVar2 = std::operator==(&type,"string");
            if (bVar2) {
              local_1b8._M_dataplus._M_p._0_4_ = 3;
              std::
              vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ::emplace_back<jsoncons::jsonschema::json_schema_type>
                        (&expected_types,(json_schema_type *)&local_1b8);
            }
            else {
              bVar2 = std::operator==(&type,"boolean");
              if (bVar2) {
                local_1b8._M_dataplus._M_p._0_4_ = 4;
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::emplace_back<jsoncons::jsonschema::json_schema_type>
                          (&expected_types,(json_schema_type *)&local_1b8);
              }
              else {
                bVar2 = std::operator==(&type,"integer");
                if (bVar2) {
                  local_1b8._M_dataplus._M_p._0_4_ = 5;
                  std::
                  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ::emplace_back<jsoncons::jsonschema::json_schema_type>
                            (&expected_types,(json_schema_type *)&local_1b8);
                }
                else {
                  bVar2 = std::operator==(&type,"number");
                  if (!bVar2) {
                    psVar3 = (schema_error *)__cxa_allocate_exception(0x18);
                    std::operator+(&local_140,&schema_location.uri_string_,": ");
                    std::operator+(&local_120,&local_140,"Invalid type \'");
                    std::operator+(&local_100,&local_120,&type);
                    std::operator+(&local_1b8,&local_100,"\'");
                    schema_error::schema_error(psVar3,&local_1b8);
                    __cxa_throw(psVar3,&schema_error::typeinfo,schema_error::~schema_error);
                  }
                  local_1b8._M_dataplus._M_p._0_4_ = 6;
                  std::
                  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ::emplace_back<jsoncons::jsonschema::json_schema_type>
                            (&expected_types,(json_schema_type *)&local_1b8);
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&type);
    }
  }
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::get_custom_message
            (&type,(compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)sch,&keyword);
  std::
  make_unique<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&,jsoncons::uri,std::__cxx11::string,std::vector<jsoncons::jsonschema::json_schema_type,std::allocator<jsoncons::jsonschema::json_schema_type>>>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             in_R8,&schema_location.uri_string_,
             (vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              *)&type);
  std::__cxx11::string::~string((string *)&type);
  std::
  _Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ::~_Vector_base(&expected_types.
                   super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                 );
  std::__cxx11::string::~string((string *)&schema_location);
  std::__cxx11::string::~string((string *)&keyword);
  return (__uniq_ptr_data<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<type_validator<Json>> make_type_validator(const compilation_context<Json>& context,
            const Json& sch, const Json& parent)
        {
            std::string keyword = "type";
            uri schema_location = context.get_base_uri();
            
            std::vector<json_schema_type> expected_types;

            switch (sch.type()) 
            { 
                case json_type::string_value: 
                {
                    auto type = sch.template as<std::string>();
                    if (type == "null")
                    {
                        expected_types.push_back(json_schema_type::null);
                    }
                    else if (type == "object")
                    {
                        expected_types.push_back(json_schema_type::object);
                    }
                    else if (type == "array")
                    {
                        expected_types.push_back(json_schema_type::array);
                    }
                    else if (type == "string")
                    {
                        expected_types.push_back(json_schema_type::string);
                    }
                    else if (type == "boolean")
                    {
                        expected_types.push_back(json_schema_type::boolean);
                    }
                    else if (type == "integer")
                    {
                        expected_types.push_back(json_schema_type::integer);
                    }
                    else if (type == "number")
                    {
                        expected_types.push_back(json_schema_type::number);
                    }
                    else
                    {
                        JSONCONS_THROW(schema_error(schema_location.string() + ": " + "Invalid type '" + type + "'"));
                    }
                    break;
                } 

                case json_type::array_value: // "type": ["type1", "type2"]
                {
                    for (const auto& item : sch.array_range())
                    {
                        auto type = item.template as<std::string>();
                        if (type == "null")
                        {
                            expected_types.push_back(json_schema_type::null);
                        }
                        else if (type == "object")
                        {
                            expected_types.push_back(json_schema_type::object);
                        }
                        else if (type == "array")
                        {
                            expected_types.push_back(json_schema_type::array);
                        }
                        else if (type == "string")
                        {
                            expected_types.push_back(json_schema_type::string);
                        }
                        else if (type == "boolean")
                        {
                            expected_types.push_back(json_schema_type::boolean);
                        }
                        else if (type == "integer")
                        {
                            expected_types.push_back(json_schema_type::integer);
                        }
                        else if (type == "number")
                        {
                            expected_types.push_back(json_schema_type::number);
                        }
                        else
                        {
                            JSONCONS_THROW(schema_error(schema_location.string() + ": " + "Invalid type '" + type + "'"));
                        }
                    }
                    break;
                }
                default:
                    break;
            }
            
            return jsoncons::make_unique<type_validator<Json>>(parent, std::move(schema_location), context.get_custom_message(keyword), 
                std::move(expected_types));
        }